

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall
vkb::SwapchainBuilder::SwapchainBuilder
          (SwapchainBuilder *this,VkPhysicalDevice physical_device,VkDevice device,
          VkSurfaceKHR surface,uint32_t graphics_queue_index,uint32_t present_queue_index)

{
  uint32_t uVar1;
  undefined7 uVar2;
  VkPhysicalDevice physical_device_local;
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_families;
  
  uVar2 = (undefined7)((ulong)surface >> 8);
  physical_device_local = physical_device;
  SwapchainInfo::SwapchainInfo(&this->info);
  (this->info).physical_device = physical_device;
  (this->info).device = device;
  (this->info).surface = surface;
  (this->info).graphics_queue_index = graphics_queue_index;
  (this->info).present_queue_index = present_queue_index;
  if (graphics_queue_index == 0xffffffff || present_queue_index == 0xffffffff) {
    detail::
    get_vector_noerror<VkQueueFamilyProperties,void(*&)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*),VkPhysicalDevice_T*const&>
              (&queue_families,(detail *)(detail::vulkan_functions()::v + 0xa0),
               (_func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **)
               &physical_device_local,
               (VkPhysicalDevice_T **)CONCAT71(uVar2,present_queue_index != 0xffffffff));
    if (graphics_queue_index == 0xffffffff) {
      uVar1 = detail::get_first_queue_index(&queue_families,1);
      (this->info).graphics_queue_index = uVar1;
    }
    if (present_queue_index == 0xffffffff) {
      uVar1 = detail::get_present_queue_index(physical_device_local,surface,&queue_families);
      (this->info).present_queue_index = uVar1;
    }
    std::_Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::
    ~_Vector_base(&queue_families.
                   super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                 );
  }
  return;
}

Assistant:

SwapchainBuilder::SwapchainBuilder(VkPhysicalDevice const physical_device,
    VkDevice const device,
    VkSurfaceKHR const surface,
    uint32_t graphics_queue_index,
    uint32_t present_queue_index) {
    info.physical_device = physical_device;
    info.device = device;
    info.surface = surface;
    info.graphics_queue_index = graphics_queue_index;
    info.present_queue_index = present_queue_index;
    if (graphics_queue_index == detail::QUEUE_INDEX_MAX_VALUE || present_queue_index == detail::QUEUE_INDEX_MAX_VALUE) {
        auto queue_families = detail::get_vector_noerror<VkQueueFamilyProperties>(
            detail::vulkan_functions().fp_vkGetPhysicalDeviceQueueFamilyProperties, physical_device);
        if (graphics_queue_index == detail::QUEUE_INDEX_MAX_VALUE)
            info.graphics_queue_index = detail::get_first_queue_index(queue_families, VK_QUEUE_GRAPHICS_BIT);
        if (present_queue_index == detail::QUEUE_INDEX_MAX_VALUE)
            info.present_queue_index = detail::get_present_queue_index(physical_device, surface, queue_families);
    }
}